

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::invite_srv_to_join_cluster(raft_server *this)

{
  peer *this_00;
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  undefined4 extraout_var;
  int local_a4;
  undefined1 local_a0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  ptr<cluster_config> c_conf;
  ptr<req_msg> req;
  string local_68;
  int32 local_44;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68._M_dataplus._M_p =
       (pointer)(((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
  local_a4 = 0xc;
  local_44 = ((((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->id_;
  c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  iVar3 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_log_store[2])();
  local_a0._8_8_ = CONCAT44(extraout_var,iVar3) + -1;
  local_a0._0_8_ = (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
  std::
  make_shared<nuraft::req_msg,unsigned_long,nuraft::msg_type,int&,int,long,unsigned_long,unsigned_long>
            ((unsigned_long *)&req,(msg_type *)&local_68,&local_a4,&this->id_,(long *)&local_44,
             (unsigned_long *)&c_conf,(unsigned_long *)(local_a0 + 8));
  get_config((raft_server *)&c_conf);
  local_a0._0_8_ =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  cluster_config::serialize((cluster_config *)(local_a0 + 8));
  local_a4 = CONCAT31(local_a4._1_3_,2);
  std::
  make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
            ((unsigned_long *)&local_68,(shared_ptr<nuraft::buffer> *)local_a0,local_a0 + 8);
  std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
  ::emplace_back<std::shared_ptr<nuraft::log_entry>>
            ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
              *)&(req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 log_entries_,(shared_ptr<nuraft::log_entry> *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  this_00 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)local_40,
             &(this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>);
  peer::send_req(this_00,(ptr<peer> *)local_40,&req,&this->ex_resp_handler_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)local_40)->_M_refcount);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*peVar1->_vptr_logger[7])();
    if (3 < iVar3) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar2 = (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_68,"sent join request to peer %d, %s",(ulong)(uint)peVar2->id_,
                 (peVar2->endpoint_)._M_dataplus._M_p);
      (*peVar1->_vptr_logger[8])
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                 ,"invite_srv_to_join_cluster",0x87,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&req.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void raft_server::invite_srv_to_join_cluster() {
    ptr<req_msg> req = cs_new<req_msg>
                       ( state_->get_term(),
                         msg_type::join_cluster_request,
                         id_,
                         srv_to_join_->get_id(),
                         0L,
                         log_store_->next_slot() - 1,
                         quick_commit_index_.load() );

    ptr<cluster_config> c_conf = get_config();
    req->log_entries().push_back
        ( cs_new<log_entry>
          ( state_->get_term(), c_conf->serialize(), log_val_type::conf ) );
    srv_to_join_->send_req(srv_to_join_, req, ex_resp_handler_);
    p_in("sent join request to peer %d, %s",
         srv_to_join_->get_id(),
         srv_to_join_->get_endpoint().c_str());
}